

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.hpp
# Opt level: O2

void __thiscall
Commands::command_handler_register_init::command_handler_register_init
          (command_handler_register_init *this,bool master)

{
  undefined7 in_register_00000031;
  
  this->master = master;
  if (command_handler_register_init::initialized != false) {
    return;
  }
  command_handler_register_init::initialized = true;
  init(this,(EVP_PKEY_CTX *)CONCAT71(in_register_00000031,master));
  return;
}

Assistant:

command_handler_register_init(bool master = false)
			: master(master)
		{
			static bool initialized;

			if (!initialized)
			{
				initialized = true;
				init();
			}
		}